

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *this)

{
  long lVar1;
  
  *(undefined4 *)
   ((this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 2)
       = 0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
          fNodeIndexes + 0x14) = 0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 3)
       = 0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
          fNodeIndexes + 0x1c) = 0xffffffff;
  *(undefined4 *)
   (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
          fNodeIndexes + 4) = 0xffffffff;
  *(undefined4 *)
   ((this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 1)
       = 0xffffffff;
  *(undefined4 *)
   ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
          fNodeIndexes + 0xc) = 0xffffffff;
  (this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
  super_TPZTetrahedron.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ebe8;
  lVar1 = 0x40;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoTetrahedra).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x160);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x150 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1380);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }